

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll-test.c
# Opt level: O0

int create_bound_socket(void)

{
  int iVar1;
  undefined1 local_20 [8];
  sockaddr_in addr;
  int enable;
  int sock;
  
  addr.sin_zero._4_4_ = socket(2,0x80001,0);
  if ((int)addr.sin_zero._4_4_ < 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x6a,"sock >= 0");
  }
  addr.sin_zero[0] = '\x01';
  addr.sin_zero[1] = '\0';
  addr.sin_zero[2] = '\0';
  addr.sin_zero[3] = '\0';
  iVar1 = setsockopt(addr.sin_zero._4_4_,1,2,addr.sin_zero,4);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x6e,"setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, &enable, sizeof(int)) == 0");
  }
  memset(local_20,0,0x10);
  local_20._0_2_ = 2;
  local_20._2_2_ = htons(0x539);
  iVar1 = inet_pton(2,"127.0.0.1",local_20 + 4);
  if (iVar1 != 1) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x73,"inet_pton(AF_INET, \"127.0.0.1\", &addr.sin_addr) == 1");
  }
  iVar1 = bind(addr.sin_zero._4_4_,(sockaddr *)local_20,0x10);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x76,"bind(sock, (struct sockaddr const *)&addr, sizeof(addr)) == 0");
  }
  iVar1._0_1_ = addr.sin_zero[4];
  iVar1._1_1_ = addr.sin_zero[5];
  iVar1._2_1_ = addr.sin_zero[6];
  iVar1._3_1_ = addr.sin_zero[7];
  return iVar1;
}

Assistant:

static int
create_bound_socket()
{
	int sock = socket(PF_INET, SOCK_STREAM | SOCK_CLOEXEC, 0);
	ATF_REQUIRE(sock >= 0);

	int enable = 1;
	ATF_REQUIRE(setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, /**/
			&enable, sizeof(int)) == 0);

	struct sockaddr_in addr = { 0 };
	addr.sin_family = AF_INET;
	addr.sin_port = htons(1337);
	ATF_REQUIRE(inet_pton(AF_INET, "127.0.0.1", &addr.sin_addr) == 1);

	ATF_REQUIRE(bind(sock, /**/
			(struct sockaddr const *)&addr, sizeof(addr)) == 0);

	return sock;
}